

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O0

void tif_10uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  OPJ_INT32 OVar5;
  byte *pbVar6;
  OPJ_UINT32 val3_1;
  OPJ_UINT32 val2_1;
  OPJ_UINT32 val1_1;
  OPJ_UINT32 val0_1;
  OPJ_UINT32 val4;
  OPJ_UINT32 val3;
  OPJ_UINT32 val2;
  OPJ_UINT32 val1;
  OPJ_UINT32 val0;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_INT32 *pDst_local;
  OPJ_BYTE *pSrc_local;
  
  pDst_local = (OPJ_INT32 *)pSrc;
  for (_val1 = 0; _val1 < (length & 0xfffffffffffffffc); _val1 = _val1 + 4) {
    OVar5 = *pDst_local;
    bVar1 = *(byte *)((long)pDst_local + 1);
    bVar2 = *(byte *)((long)pDst_local + 2);
    pbVar6 = (byte *)(pDst_local + 1);
    bVar3 = *(byte *)((long)pDst_local + 3);
    pDst_local = (OPJ_INT32 *)((long)pDst_local + 5);
    bVar4 = *pbVar6;
    pDst[_val1] = (uint)(byte)OVar5 << 2 | (uint)(bVar1 >> 6);
    pDst[_val1 + 1] = (bVar1 & 0x3f) << 4 | (uint)(bVar2 >> 4);
    pDst[_val1 + 2] = (bVar2 & 0xf) << 6 | (uint)(bVar3 >> 2);
    pDst[_val1 + 3] = (bVar3 & 3) << 8 | (uint)bVar4;
  }
  if ((length & 3) != 0) {
    bVar1 = *(byte *)((long)pDst_local + 1);
    pDst[_val1] = (uint)(byte)*pDst_local << 2 | (uint)(bVar1 >> 6);
    if (1 < (length & 3)) {
      bVar2 = *(byte *)((long)pDst_local + 2);
      pDst[_val1 + 1] = (bVar1 & 0x3f) << 4 | (uint)(bVar2 >> 4);
      if (2 < (length & 3)) {
        pDst[_val1 + 2] = (bVar2 & 0xf) << 6 | (uint)(*(byte *)((long)pDst_local + 3) >> 2);
      }
    }
  }
  return;
}

Assistant:

static void tif_10uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                         OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)3U); i += 4U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        OPJ_UINT32 val2 = *pSrc++;
        OPJ_UINT32 val3 = *pSrc++;
        OPJ_UINT32 val4 = *pSrc++;

        pDst[i + 0] = (OPJ_INT32)((val0 << 2) | (val1 >> 6));
        pDst[i + 1] = (OPJ_INT32)(((val1 & 0x3FU) << 4) | (val2 >> 4));
        pDst[i + 2] = (OPJ_INT32)(((val2 & 0xFU) << 6) | (val3 >> 2));
        pDst[i + 3] = (OPJ_INT32)(((val3 & 0x3U) << 8) | val4);

    }
    if (length & 3U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        length = length & 3U;
        pDst[i + 0] = (OPJ_INT32)((val0 << 2) | (val1 >> 6));

        if (length > 1U) {
            OPJ_UINT32 val2 = *pSrc++;
            pDst[i + 1] = (OPJ_INT32)(((val1 & 0x3FU) << 4) | (val2 >> 4));
            if (length > 2U) {
                OPJ_UINT32 val3 = *pSrc++;
                pDst[i + 2] = (OPJ_INT32)(((val2 & 0xFU) << 6) | (val3 >> 2));
            }
        }
    }
}